

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mstring.c
# Opt level: O2

int mputchar(mstring *s,int ch)

{
  char *__ptr;
  int iVar1;
  char *pcVar2;
  
  if ((s != (mstring *)0x0) && (__ptr = s->base, __ptr != (char *)0x0)) {
    pcVar2 = s->ptr;
    if (pcVar2 == s->end) {
      iVar1 = (int)pcVar2 - (int)__ptr;
      pcVar2 = (char *)realloc(__ptr,(long)(iVar1 * 2 + 8));
      s->base = pcVar2;
      if (pcVar2 == (char *)0x0) {
        s->ptr = (char *)0x0;
        s->end = (char *)0x0;
        return ch;
      }
      pcVar2 = pcVar2 + iVar1;
      s->end = pcVar2 + (long)iVar1 + 8;
    }
    s->ptr = pcVar2 + 1;
    *pcVar2 = (char)ch;
  }
  return ch;
}

Assistant:

int mputchar(struct mstring *s, int ch)
{
    if (!s || !s->base) return ch;
    if (s->ptr == s->end) {
	int len = s->end - s->base;
	if ((s->base = realloc(s->base, len+len+TAIL))) {
	    s->ptr = s->base + len;
	    s->end = s->base + len+len+TAIL; }
	else {
	    s->ptr = s->end = 0;
	    return ch; } }
    *s->ptr++ = ch;
    return ch;
}